

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

TaskInfo * __thiscall
anon_unknown.dwarf_3d066b::BuildEngineImpl::getTaskInfo(BuildEngineImpl *this,Task *task)

{
  _Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
  _Var1;
  Task *local_20;
  
  local_20 = task;
  std::mutex::lock(&this->taskInfosMutex);
  _Var1._M_cur = (__node_type *)
                 std::
                 unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
                 ::find(&this->taskInfos,&local_20);
  if (_Var1._M_cur != (__node_type *)0x0) {
    _Var1._M_cur = (__node_type *)((long)_Var1._M_cur + 0x10);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->taskInfosMutex);
  return (TaskInfo *)_Var1._M_cur;
}

Assistant:

TaskInfo* getTaskInfo(Task* task) {
    std::lock_guard<std::mutex> guard(taskInfosMutex);
    auto it = taskInfos.find(task);
    return it == taskInfos.end() ? nullptr : &it->second;
  }